

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QFontEngine::FaceId,QFreetypeFace*>::emplace_helper<QFreetypeFace*>
          (QHash<QFontEngine::FaceId,QFreetypeFace*> *this,FaceId *key,QFreetypeFace **args)

{
  Entry *pEVar1;
  piter pVar2;
  uint uVar3;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_>::
  findOrInsert<QFontEngine::FaceId>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> **)this,key);
  pEVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  uVar3 = (uint)(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
                [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QFontEngine::FaceId,QFreetypeFace*>::createInPlace<QFreetypeFace*>
              ((Node<QFontEngine::FaceId,_QFreetypeFace_*> *)((pEVar1->storage).data + uVar3 * 0x50)
               ,key,args);
  }
  else {
    *(QFreetypeFace **)((pEVar1->storage).data + (ulong)(uVar3 * 0x50) + 0x48) = *args;
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }